

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_getn(Table *t)

{
  uint uVar1;
  TValue *pTVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong key;
  bool bVar7;
  
  uVar4 = t->sizearray;
  uVar3 = (ulong)uVar4;
  if ((uVar4 == 0) || (t->array[uVar4 - 1].tt_ != 0)) {
    if (t->lastfree != (Node *)0x0) {
      uVar4 = uVar4 + 1;
      pTVar2 = luaH_getint(t,(ulong)uVar4);
      key = (ulong)uVar4;
      if (pTVar2->tt_ == 0) {
        key = (ulong)uVar4;
      }
      else {
        do {
          uVar3 = key;
          if (0x3fffffff < (uint)uVar3) {
            iVar5 = -1;
            do {
              pTVar2 = luaH_getint(t,(ulong)(iVar5 + 2));
              iVar5 = iVar5 + 1;
            } while (pTVar2->tt_ != 0);
            return iVar5;
          }
          key = (ulong)((uint)uVar3 * 2);
          pTVar2 = luaH_getint(t,key);
        } while (pTVar2->tt_ != 0);
      }
      uVar4 = (uint)uVar3;
      uVar1 = (int)key - uVar4;
      while (1 < uVar1) {
        uVar4 = (uint)((int)key + (int)uVar3) >> 1;
        pTVar2 = luaH_getint(t,(ulong)uVar4);
        uVar6 = (ulong)uVar4;
        if (pTVar2->tt_ == 0) {
          key = (ulong)uVar4;
          uVar6 = uVar3;
        }
        uVar4 = (uint)uVar6;
        uVar3 = uVar6;
        uVar1 = (int)key - uVar4;
      }
    }
  }
  else {
    bVar7 = uVar4 != 1;
    uVar4 = 0;
    if (bVar7) {
      uVar4 = 0;
      do {
        uVar1 = uVar4 + (int)uVar3 >> 1;
        if (t->array[uVar1 - 1].tt_ == 0) {
          uVar3 = (ulong)uVar1;
          uVar1 = uVar4;
        }
        uVar4 = uVar1;
      } while (1 < (int)uVar3 - uVar4);
    }
  }
  return uVar4;
}

Assistant:

int luaH_getn(Table *t) {
    unsigned int j = t->sizearray;
    if (j > 0 && ttisnil(&t->array[j - 1])) {
        /* there is a boundary in the array part: (binary) search for it */
        unsigned int i = 0;
        while (j - i > 1) {
            unsigned int m = (i + j) / 2;
            if (ttisnil(&t->array[m - 1])) j = m;
            else i = m;
        }
        return i;
    }
        /* else must find a boundary in hash part */
    else if (isdummy(t))  /* hash part is empty? */
        return j;  /* that is easy... */
    else return unbound_search(t, j);
}